

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  pointer ppVar3;
  bool bVar4;
  pointer ppcVar5;
  string *name;
  LinkLibraryVectorType *pLVar6;
  cmTarget *this_01;
  iterator iVar7;
  ostream *this_02;
  mapped_type *this_03;
  mapped_type *ppcVar8;
  pointer ppcVar9;
  pointer ppVar10;
  string libName;
  ostringstream ostr;
  int local_224;
  string local_1e8 [32];
  string local_1c8;
  ostringstream local_1a8 [376];
  
  ppcVar1 = (this->LocalGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_224 = cnt;
  for (ppcVar5 = (this->LocalGenerators->
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1
      ) {
    ppcVar2 = ((*ppcVar5)->GeneratorTargets).
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar9 = ((*ppcVar5)->GeneratorTargets).
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar2;
        ppcVar9 = ppcVar9 + 1) {
      this_00 = *ppcVar9;
      name = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      bVar4 = IgnoreThisTarget(this,name);
      if (!bVar4) {
        pLVar6 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this_00->Target);
        ppVar3 = (pLVar6->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar10 = (pLVar6->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar3;
            ppVar10 = ppVar10 + 1) {
          std::__cxx11::string::string((string *)&local_1c8,(string *)ppVar10);
          bVar4 = IgnoreThisTarget(this,&local_1c8);
          if (!bVar4) {
            bVar4 = cmGlobalGenerator::IsAlias(this->GlobalGenerator,&local_1c8);
            if ((bVar4) &&
               (this_01 = cmGlobalGenerator::FindTarget(this->GlobalGenerator,&local_1c8,false),
               this_01 != (cmTarget *)0x0)) {
              cmTarget::GetName_abi_cxx11_(this_01);
              std::__cxx11::string::_M_assign((string *)&local_1c8);
            }
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::find(&(this->TargetPtrs)._M_t,&local_1c8);
            if ((_Rb_tree_header *)iVar7._M_node ==
                &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              this_02 = std::operator<<((ostream *)local_1a8,(string *)&this->GraphNodePrefix);
              std::ostream::operator<<(this_02,local_224);
              std::__cxx11::stringbuf::str();
              this_03 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&this->TargetNamesNodes,&local_1c8);
              std::__cxx11::string::operator=((string *)this_03,local_1e8);
              std::__cxx11::string::~string(local_1e8);
              ppcVar8 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::operator[](&this->TargetPtrs,&local_1c8);
              local_224 = local_224 + 1;
              *ppcVar8 = (mapped_type)0x0;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
            }
          }
          std::__cxx11::string::~string((string *)&local_1c8);
        }
      }
    }
  }
  return local_224;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      const std::string& realTargetName = target->GetName();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      const cmTarget::LinkLibraryVectorType* ll =
        &(target->Target->GetOriginalLinkLibraries());
      for (auto const& llit : *ll) {
        std::string libName = llit.first;
        if (this->IgnoreThisTarget(libName)) {
          // Skip ignored targets
          continue;
        }

        if (GlobalGenerator->IsAlias(libName)) {
          const auto tgt = GlobalGenerator->FindTarget(libName);
          if (tgt) {
            libName = tgt->GetName();
          }
        }

        std::map<std::string, const cmGeneratorTarget*>::const_iterator tarIt =
          this->TargetPtrs.find(libName);
        if (tarIt == this->TargetPtrs.end()) {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = nullptr;
          // str << "    \"" << ostr << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
        }
      }
    }
  }
  return cnt;
}